

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O2

void __thiscall
CoinSelection_SelectCoins_Simple_Error_outparameter_nullptr_Test::TestBody
          (CoinSelection_SelectCoins_Simple_Error_outparameter_nullptr_Test *this)

{
  bool bVar1;
  Amount AVar2;
  bool use_bnb;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> ret;
  Amount local_d0;
  Amount local_c0;
  _Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_b0;
  CoinSelectionOption local_98;
  Amount fee;
  Amount select_value;
  
  AVar2 = cfd::core::Amount::CreateBySatoshiAmount(100000000);
  local_c0.amount_ = AVar2.amount_;
  local_c0.ignore_check_ = AVar2.ignore_check_;
  cfd::core::Amount::Amount(&select_value);
  cfd::core::Amount::Amount(&fee);
  AVar2 = cfd::core::Amount::CreateBySatoshiAmount(0x5dc);
  local_d0.amount_ = AVar2.amount_;
  local_d0.ignore_check_ = AVar2.ignore_check_;
  use_bnb = false;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    GetBitcoinUtxoList();
    GetBitcoinOption();
    cfd::CoinSelection::SelectCoins
              (&ret,&exp_selection,&local_c0,
               (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&local_b0,&exp_filter,&local_98,
               &local_d0,(Amount *)0x0,&fee,&use_bnb);
    cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&local_98.fee_asset_);
    std::_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~_Vector_base(&local_b0);
    std::_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~_Vector_base
              (&ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>);
  }
  testing::Message::Message((Message *)&local_98);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&ret,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
             ,0x225,
             "Expected: std::vector<Utxo> ret = exp_selection.SelectCoins( target_amount, GetBitcoinUtxoList(), exp_filter, GetBitcoinOption(), tx_fee, nullptr, &fee, &use_bnb) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&ret,(Message *)&local_98);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ret);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_98);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_Simple_Error_outparameter_nullptr)
{
  Amount target_amount = Amount::CreateBySatoshiAmount(100000000);
  Amount select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  bool use_bnb = false;
  EXPECT_THROW(std::vector<Utxo> ret = exp_selection.SelectCoins(
      target_amount, GetBitcoinUtxoList(), exp_filter, GetBitcoinOption(),
      tx_fee, nullptr, &fee, &use_bnb), CfdException);
}